

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O0

int32 ngram_add_word_internal(ngram_model_t *model,char *word,int32 classid)

{
  int32 iVar1;
  void *pvVar2;
  char *pcVar3;
  uint local_28;
  int local_24;
  int32 wid;
  int32 classid_local;
  char *word_local;
  ngram_model_t *model_local;
  
  local_24 = classid;
  _wid = word;
  word_local = (char *)model;
  iVar1 = hash_table_lookup_int32(model->wid,word,(int32 *)&local_28);
  if (iVar1 == 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x268,"Omit duplicate word \'%s\'\n",_wid);
    model_local._4_4_ = local_28;
  }
  else {
    local_28 = *(uint *)(word_local + 0x14);
    if (-1 < local_24) {
      local_28 = local_24 << 0x18 | 0x80000000U | local_28;
    }
    if (*(int *)(word_local + 0x10) <= *(int *)(word_local + 0x14)) {
      *(int *)(word_local + 0x10) = *(int *)(word_local + 0x10) + 10;
      pvVar2 = __ckd_realloc__(*(void **)(word_local + 0x38),(long)*(int *)(word_local + 0x10) << 3,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                               ,0x277);
      *(void **)(word_local + 0x38) = pvVar2;
    }
    pcVar3 = __ckd_salloc__(_wid,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x27b);
    *(char **)(*(long *)(word_local + 0x38) + (long)*(int *)(word_local + 0x14) * 8) = pcVar3;
    pvVar2 = hash_table_enter(*(hash_table_t **)(word_local + 0x40),
                              *(char **)(*(long *)(word_local + 0x38) +
                                        (long)*(int *)(word_local + 0x14) * 8),
                              (void *)(long)(int)local_28);
    if ((uint)pvVar2 != local_28) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x281,"Hash insertion failed for word %s => %p (should not happen)\n",
              *(undefined8 *)(*(long *)(word_local + 0x38) + (long)*(int *)(word_local + 0x14) * 8),
              (long)(int)local_28);
    }
    *(int *)(word_local + 0x14) = *(int *)(word_local + 0x14) + 1;
    model_local._4_4_ = local_28;
  }
  return model_local._4_4_;
}

Assistant:

int32
ngram_add_word_internal(ngram_model_t * model,
                        const char *word, int32 classid)
{

    /* Check for hash collisions. */
    int32 wid;
    if (hash_table_lookup_int32(model->wid, word, &wid) == 0) {
        E_WARN("Omit duplicate word '%s'\n", word);
        return wid;
    }

    /* Take the next available word ID */
    wid = model->n_words;
    if (classid >= 0) {
        wid = NGRAM_CLASSWID(wid, classid);
    }

    /* Reallocate word_str if necessary. */
    if (model->n_words >= model->n_1g_alloc) {
        model->n_1g_alloc += UG_ALLOC_STEP;
        model->word_str = ckd_realloc(model->word_str,
                                      sizeof(*model->word_str) *
                                      model->n_1g_alloc);
    }
    /* Add the word string in the appropriate manner. */
    /* Class words are always dynamically allocated. */
    model->word_str[model->n_words] = ckd_salloc(word);
    /* Now enter it into the hash table. */
    if (hash_table_enter_int32
        (model->wid, model->word_str[model->n_words], wid) != wid) {
        E_ERROR
            ("Hash insertion failed for word %s => %p (should not happen)\n",
             model->word_str[model->n_words], (void *) (size_t) (wid));
    }
    /* Increment number of words. */
    ++model->n_words;
    return wid;
}